

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minideen.hpp
# Opt level: O1

DSFrame * __thiscall
MiniDeen::GetFrame(DSFrame *__return_storage_ptr__,MiniDeen *this,int n,
                  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                  *in_frames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  mapped_type *old;
  byte bVar5;
  int iVar6;
  uint8_t *__dest;
  int iVar7;
  long lVar8;
  uint8_t *__src;
  bool bVar9;
  int n_local;
  mapped_type src;
  
  n_local = n;
  old = std::__detail::
        _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)in_frames,&n_local);
  DSFrame::DSFrame(&src,old);
  if (this->bypass == true) {
    DSFrame::DSFrame(__return_storage_ptr__,&src);
  }
  else {
    DSFrame::Create(__return_storage_ptr__,&src,false,false);
    if (0 < (this->super_Filter).in_vi.Format.Planes) {
      lVar8 = 0;
      do {
        iVar1 = src.StrideBytes[lVar8];
        __src = src.SrcPointers[lVar8];
        bVar9 = ((this->super_Filter).in_vi.Format.IsFamilyYUV & (int)lVar8 - 1U < 2) == 0;
        bVar5 = (byte)(this->super_Filter).in_vi.Format.SSH;
        if (bVar9) {
          bVar5 = 0;
        }
        bVar4 = (byte)(this->super_Filter).in_vi.Format.SSW;
        if (bVar9) {
          bVar4 = 0;
        }
        iVar7 = (this->super_Filter).in_vi.Height >> (bVar5 & 0x1f);
        iVar6 = (this->super_Filter).in_vi.Width >> (bVar4 & 0x1f);
        iVar2 = __return_storage_ptr__->StrideBytes[lVar8];
        __dest = __return_storage_ptr__->DstPointers[lVar8];
        if (this->process[lVar8] == 3) {
          (*this->minideen_core)
                    (__src,__dest,iVar6,iVar7,iVar1,iVar2,this->threshold[lVar8],this->radius[lVar8]
                    );
        }
        else if (this->process[lVar8] == 2) {
          if (iVar1 == iVar2) {
            memcpy(__dest,__src,(long)(iVar7 * iVar2));
          }
          else if (0 < iVar7) {
            iVar3 = (this->super_Filter).in_vi.Format.BytesPerSample;
            do {
              memcpy(__dest,__src,(long)iVar6 * (long)iVar3);
              __dest = __dest + iVar2;
              __src = __src + iVar1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_Filter).in_vi.Format.Planes);
    }
  }
  DSFrame::~DSFrame(&src);
  return __return_storage_ptr__;
}

Assistant:

DSFrame GetFrame(int n, std::unordered_map<int, DSFrame> in_frames) override
  {
    auto src = in_frames[n];
    if (bypass)
      return src;
    auto dst = src.Create(false);

    for (int p = 0; p < in_vi.Format.Planes; p++)
    {
      bool chroma = in_vi.Format.IsFamilyYUV && p > 0 && p < 3;
      auto height = in_vi.Height;
      auto width = in_vi.Width;
      auto src_stride = src.StrideBytes[p];
      auto src_ptr = src.SrcPointers[p];
      auto dst_stride = dst.StrideBytes[p];
      auto dst_ptr = dst.DstPointers[p];

      if (chroma) {
        height >>= in_vi.Format.SSH;
        width >>= in_vi.Format.SSW;
      }

      if (process[p] == 2) {
        framecpy(dst_ptr, dst_stride, src_ptr, src_stride, width * in_vi.Format.BytesPerSample, height);
        continue;
      }
      if (process[p] != 3)
        continue;

      minideen_core(src_ptr, dst_ptr, width, height, src_stride, dst_stride, threshold[p], radius[p]);
    }

    return dst;
  }